

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O2

void uxsel_tell(NetSocket *s)

{
  size_t sVar1;
  uint uVar2;
  uint rwx;
  
  rwx = 0;
  if (s->pending_error == 0) {
    if (s->listener == false) {
      if (s->connected == true) {
        uVar2 = 0;
        if (s->frozen == false) {
          uVar2 = (s->incomingeof ^ 1) * 5;
        }
      }
      else {
        uVar2 = 2;
      }
      sVar1 = bufchain_size(&s->output_data);
      rwx = uVar2 | 2;
      if (sVar1 == 0) {
        rwx = uVar2;
      }
    }
    else {
      rwx = 1;
    }
  }
  uxsel_set(s->s,rwx,net_select_result);
  return;
}

Assistant:

static void uxsel_tell(NetSocket *s)
{
    int rwx = 0;
    if (!s->pending_error) {
        if (s->listener) {
            rwx |= SELECT_R;           /* read == accept */
        } else {
            if (!s->connected)
                rwx |= SELECT_W;       /* write == connect */
            if (s->connected && !s->frozen && !s->incomingeof)
                rwx |= SELECT_R | SELECT_X;
            if (bufchain_size(&s->output_data))
                rwx |= SELECT_W;
        }
    }
    uxsel_set(s->s, rwx, net_select_result);
}